

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Visible_Animator_Interrupt_proc(Am_Object *interp,Am_Value *new_target)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value *value2;
  Am_Object local_78;
  Am_Anim_Update_Method local_70;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object sub_animator;
  undefined1 local_28 [8];
  Am_Value old_target;
  Am_Value *new_target_local;
  Am_Object *interp_local;
  
  old_target.value = (anon_union_8_8_ea4c8939_for_value)new_target;
  pAVar2 = Am_Object::Get(interp,0xf9,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(interp,0x182,0);
    Am_Value::Am_Value((Am_Value *)local_28,pAVar2);
    bVar1 = Am_Value::operator==((Am_Value *)local_28,old_target.value);
    if (bVar1) {
      Am_Object::Am_Object(&sub_animator,interp);
      Am_Abort_Animator(&sub_animator);
      Am_Object::~Am_Object(&sub_animator);
    }
    else {
      pAVar2 = Am_Object::Get(interp,0x108,0);
      Am_Object::Am_Object(&local_48,pAVar2);
      Am_Object::Am_Object(&local_50,&local_48);
      Am_Abort_Animator(&local_50);
      Am_Object::~Am_Object(&local_50);
      Am_Object::Am_Object(&local_58,&local_48);
      pAVar2 = Am_Object::Get(&local_48,0x169,0);
      bVar1 = Am_Value::operator_cast_to_bool(old_target.value);
      value2 = Am_Object::Get(interp,0x10a - bVar1,0);
      Am_Start_Animator(&local_58,pAVar2,value2);
      Am_Object::~Am_Object(&local_58);
      Am_Object::Set(interp,0x181,(Am_Value *)local_28,0);
      Am_Object::Set(interp,0x182,(Am_Value *)old_target.value.wrapper_value,0);
      Am_Object::Set(interp,0x169,true,0);
      Am_Object::Am_Object(&local_60,interp);
      Am_Set_Animated_Slots(&local_60);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&local_48);
    }
    Am_Value::~Am_Value((Am_Value *)local_28);
  }
  else {
    pAVar2 = Am_Object::Get(&Am_Animator,0xf5,0);
    Am_Anim_Update_Method::Am_Anim_Update_Method(&local_70,pAVar2);
    Am_Object::Am_Object(&local_78,interp);
    (*local_70.Call)((Am_Object_Data *)&local_78,(Am_Value *)old_target.value.wrapper_value);
    Am_Object::~Am_Object(&local_78);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Anim_Update_Method, void, Am_Visible_Animator_Interrupt,
                 (Am_Object interp, const Am_Value &new_target))
{
  Am_INTER_TRACE_PRINT(interp, "Visible Interrupt of " << interp);

  if ((bool)interp.Get(Am_INTERRUPTIBLE)) {
    Am_Value old_target = interp.Get(Am_VALUE_2);

    if (old_target == new_target) {
      // interrupted animation to target with another set to the same target;
      // just abort
      Am_Abort_Animator(interp);
    } else {
      // need to reverse course and head back in the other direction,
      // but without sudden jumps in sub-animator
      Am_INTER_TRACE_PRINT(
          interp, "Visible Interrupt changing direction, now animating to "
                      << new_target);

      // abort sub animator first (which leaves it at current position)
      Am_Object sub_animator = interp.Get(Am_SUB_ANIMATOR);
      Am_Abort_Animator(sub_animator);

      // sub-animator should start from its current position (Am_VALUE)
      // and head for either visible or invisible location,
      // depending on new_target
      Am_Start_Animator(sub_animator, sub_animator.Get(Am_VALUE),
                        interp.Get((bool)new_target ? Am_VISIBLE_LOCATION
                                                    : Am_INVISIBLE_LOCATION));

      interp.Set(Am_VALUE_1, old_target);
      interp.Set(Am_VALUE_2, new_target);
      interp.Set(Am_VALUE, true); //make visible throughout animation

      Am_Set_Animated_Slots(interp);
    }
  } else {
    // not interruptible -- pass back to prototype's method

    Am_Anim_Update_Method(Am_Animator.Get(Am_INTERRUPT_METHOD))
        .Call(interp, new_target);
  }
}